

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor_database.cc
# Opt level: O2

pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
* __thiscall
google::protobuf::EncodedDescriptorDatabase::DescriptorIndex::SymbolCompare::GetParts
          (pair<google::protobuf::stringpiece_internal::StringPiece,_google::protobuf::stringpiece_internal::StringPiece>
           *__return_storage_ptr__,SymbolCompare *this,SymbolEntry *entry)

{
  StringPiece SVar1;
  StringPiece SVar2;
  
  SVar1 = SymbolEntry::package(entry,this->index);
  SVar2 = SymbolEntry::symbol(entry,this->index);
  if (SVar1.length_ == 0) {
    (__return_storage_ptr__->second).ptr_ = (char *)0x0;
    (__return_storage_ptr__->second).length_ = 0;
  }
  else {
    __return_storage_ptr__->second = SVar2;
    SVar2 = SVar1;
  }
  __return_storage_ptr__->first = SVar2;
  return __return_storage_ptr__;
}

Assistant:

std::pair<StringPiece, StringPiece> GetParts(
        const SymbolEntry& entry) const {
      auto package = entry.package(index);
      if (package.empty()) return {entry.symbol(index), StringPiece{}};
      return {package, entry.symbol(index)};
    }